

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O1

block * gen_relation(compiler_state_t *cstate,int code,arth *a0,arth *a1,int reversed)

{
  slist *psVar1;
  block *b0;
  block *b1;
  slist *psVar2;
  slist *psVar3;
  slist *psVar4;
  block *b1_00;
  slist *psVar5;
  block *b0_00;
  
  psVar2 = (slist *)newchunk(cstate,0x28);
  (psVar2->s).code = 0x61;
  (psVar2->s).k = a1->regno;
  psVar3 = (slist *)newchunk(cstate,0x28);
  (psVar3->s).code = 0x60;
  (psVar3->s).k = a0->regno;
  if (code == 0x10) {
    psVar4 = (slist *)newchunk(cstate,0x28);
    (psVar4->s).code = 0x1c;
    b1_00 = (block *)newchunk(cstate,0x120);
    (b1_00->s).code = 0x15;
    b1_00->head = b1_00;
    psVar1 = psVar3;
    do {
      psVar5 = psVar1;
      psVar1 = psVar5->next;
    } while (psVar1 != (slist *)0x0);
    psVar5->next = psVar4;
  }
  else {
    b1_00 = (block *)newchunk(cstate,0x120);
    (b1_00->s).code = code | 0xd;
    b1_00->head = b1_00;
  }
  psVar1 = psVar2;
  if (reversed != 0) {
    b1_00->sense = (uint)(b1_00->sense == 0);
  }
  do {
    psVar4 = psVar1;
    psVar1 = psVar4->next;
  } while (psVar1 != (slist *)0x0);
  psVar4->next = psVar3;
  psVar3 = a1->s;
  psVar1 = psVar3;
  do {
    psVar4 = psVar1;
    psVar1 = psVar4->next;
  } while (psVar1 != (slist *)0x0);
  psVar4->next = psVar2;
  psVar2 = a0->s;
  psVar1 = psVar2;
  do {
    psVar4 = psVar1;
    psVar1 = psVar4->next;
  } while (psVar1 != (slist *)0x0);
  psVar4->next = psVar3;
  b1_00->stmts = psVar2;
  cstate->regused[a0->regno] = 0;
  cstate->regused[a1->regno] = 0;
  b0 = a0->b;
  b1 = a1->b;
  b0_00 = b1;
  if ((b0 != (block *)0x0) && (b0_00 = b0, b1 != (block *)0x0)) {
    gen_and(b0,b1);
    b0_00 = b1;
  }
  if (b0_00 != (block *)0x0) {
    gen_and(b0_00,b1_00);
  }
  return b1_00;
}

Assistant:

struct block *
gen_relation(compiler_state_t *cstate, int code, struct arth *a0,
    struct arth *a1, int reversed)
{
	struct slist *s0, *s1, *s2;
	struct block *b, *tmp;

	s0 = xfer_to_x(cstate, a1);
	s1 = xfer_to_a(cstate, a0);
	if (code == BPF_JEQ) {
		s2 = new_stmt(cstate, BPF_ALU|BPF_SUB|BPF_X);
		b = new_block(cstate, JMP(code));
		sappend(s1, s2);
	}
	else
		b = new_block(cstate, BPF_JMP|code|BPF_X);
	if (reversed)
		gen_not(b);

	sappend(s0, s1);
	sappend(a1->s, s0);
	sappend(a0->s, a1->s);

	b->stmts = a0->s;

	free_reg(cstate, a0->regno);
	free_reg(cstate, a1->regno);

	/* 'and' together protocol checks */
	if (a0->b) {
		if (a1->b) {
			gen_and(a0->b, tmp = a1->b);
		}
		else
			tmp = a0->b;
	} else
		tmp = a1->b;

	if (tmp)
		gen_and(tmp, b);

	return b;
}